

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           *__return_storage_ptr__,ConfidentialTransaction *this,
          vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *blinding_keys)

{
  bool bVar1;
  CfdException *this_00;
  pointer pCVar2;
  pointer pCVar3;
  uint tx_out_index;
  ulong uVar4;
  unsigned_long local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [144];
  
  pCVar3 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = ((long)pCVar2 - (long)pCVar3) / 0xf8;
  local_c8 = (long)(blinding_keys->
                   super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(blinding_keys->
                   super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5;
  if (local_d0 == local_c8) {
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (tx_out_index = 0; uVar4 = (ulong)tx_out_index,
        uVar4 < (ulong)(((long)pCVar2 - (long)pCVar3) / 0xf8); tx_out_index = tx_out_index + 1) {
      AbstractTxOut::GetLockingScript((Script *)local_c0,&pCVar3[uVar4].super_AbstractTxOut);
      bVar1 = Script::IsEmpty((Script *)local_c0);
      Script::~Script((Script *)local_c0);
      if (!bVar1) {
        bVar1 = Privkey::IsValid((blinding_keys->
                                 super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>
                                 )._M_impl.super__Vector_impl_data._M_start + uVar4);
        if (bVar1) {
          UnblindTxOut((UnblindParameter *)local_c0,this,tx_out_index,
                       (blinding_keys->
                       super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar4);
          ::std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
          emplace_back<cfd::core::UnblindParameter>
                    (__return_storage_ptr__,(UnblindParameter *)local_c0);
          UnblindParameter::~UnblindParameter((UnblindParameter *)local_c0);
        }
      }
      pCVar3 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar2 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    return __return_storage_ptr__;
  }
  local_c0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_c0._8_4_ = 0xb69;
  local_c0._16_8_ = (long)"CfdUnblindTxOut" + 3;
  logger::warn<unsigned_long,unsigned_long>
            ((CfdSourceLocation *)local_c0,
             "Unmatch size blinding_keys and txouts.: txout num=[{}], blinding key num=[{}]",
             &local_d0,&local_c8);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_c0,"Unmatch size blinding_keys and txouts.",(allocator *)&local_d0);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_c0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<UnblindParameter> ConfidentialTransaction::UnblindTxOut(
    const std::vector<Privkey> &blinding_keys) {
  // validate input vector size
  if (vout_.size() != blinding_keys.size()) {
    warn(
        CFD_LOG_SOURCE,
        "Unmatch size blinding_keys and txouts.:"
        " txout num=[{}], blinding key num=[{}]",
        vout_.size(), blinding_keys.size());
    throw CfdException(
        kCfdIllegalArgumentError, "Unmatch size blinding_keys and txouts.");
  }

  std::vector<UnblindParameter> results;
  for (uint32_t index = 0; index < vout_.size(); index++) {
    // skip if vout is txout for fee
    if (vout_[index].GetLockingScript().IsEmpty()) {
      // fall-through
    } else if (!blinding_keys[index].IsValid()) {
      // fall-through
    } else {
      results.push_back(UnblindTxOut(index, blinding_keys[index]));
    }
  }

  return results;
}